

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O0

void screen_byte_1(ubyte iobyte,uint address)

{
  ubyte uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  undefined2 local_e;
  uint bitsperline;
  uint virt_y_cord;
  uint y_cord;
  uint x_cord;
  uint address_local;
  ubyte iobyte_local;
  
  uVar1 = crt_regs[1];
  bitsperline = address;
  if (address < screen_start) {
    bitsperline = address + (-0x8000 - ram_screen_start);
  }
  uVar2 = bitsperline - screen_start;
  uVar3 = (short)((ulong)uVar2 / (ulong)(long)(int)((uint)crt_regs[1] << 3)) * 8 + uVar2 % 8;
  uVar4 = uVar3 + uVar3 / 4;
  local_e = (ushort)((ulong)uVar2 % (ulong)(long)(int)((uint)crt_regs[1] << 3)) & 0xfff8;
  if (crt_regs[1] == 'P') {
    iVar5 = 0;
    if ((iobyte & 0x80) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 0x40) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 1,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 0x20) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 2,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 0x10) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 3,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 8) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 4,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 4) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 5,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 2) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 6,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 1) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 7,uVar4,iVar5);
  }
  else {
    local_e = local_e * 2;
    iVar5 = 0;
    if ((iobyte & 0x80) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 0x80) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 1,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 0x40) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 2,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 0x40) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 3,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 0x20) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 4,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 0x20) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 5,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 0x10) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 6,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 0x10) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 7,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 8) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 8,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 8) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 9,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 4) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 10,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 4) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 0xb,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 2) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 0xc,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 2) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 0xd,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 1) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 0xe,uVar4,iVar5);
    iVar5 = 0;
    if ((iobyte & 1) != 0) {
      iVar5 = 8;
    }
    putpixel(local_e + 0xf,uVar4,iVar5);
  }
  if ((uVar3 & 3) == 0) {
    uVar4 = uVar4 - 1;
    if (uVar1 == 'P') {
      iVar5 = 0;
      if ((iobyte & 0x80) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 0x40) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 1,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 0x20) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 2,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 0x10) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 3,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 8) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 4,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 4) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 5,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 2) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 6,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 1) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 7,uVar4,iVar5);
    }
    else {
      iVar5 = 0;
      if ((iobyte & 0x80) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 0x80) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 1,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 0x40) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 2,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 0x40) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 3,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 0x20) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 4,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 0x20) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 5,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 0x10) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 6,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 0x10) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 7,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 8) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 8,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 8) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 9,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 4) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 10,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 4) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 0xb,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 2) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 0xc,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 2) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 0xd,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 1) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 0xe,uVar4,iVar5);
      iVar5 = 0;
      if ((iobyte & 1) != 0) {
        iVar5 = 8;
      }
      putpixel(local_e + 0xf,uVar4,iVar5);
    }
  }
  return;
}

Assistant:

void screen_byte_1(ubyte iobyte, uint address) {
    uint x_cord = 0;                 // init real x cordinate variable
    uint y_cord = 0;                 // init real y cordinate variable
    uint virt_y_cord = 0;            // init actual pc output y coordinate
    uint bitsperline;              // variable holding bits per line

    // deal with hardware wrap-around
    if (address < screen_start) address += (0x8000 - ram_screen_start);
    address -= screen_start;
    bitsperline = crt_regs[1] << 3;    // calculate bits per line

    y_cord = address / (bitsperline);  // calculate character row of address
    y_cord *= 8;                     // convert to pixel row
    y_cord += (address % 8);           // add fraction of character to pixel row

    virt_y_cord += y_cord + y_cord / 4;  // scale output to pc screen

    x_cord = address % (bitsperline);  // calculate x coordinate
    x_cord &= 0xFFF8;                // mask off lower 3 bits

    if (bitsperline == 640)          // if an 80 character mode
    {
        putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
        putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
        putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
        putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
        putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
        putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
        putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
        putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
    }

    else                           // if not an 80 character mode
    {
        x_cord <<= 1;                    // scale output to fit pc screen
        putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
        putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
        putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
        putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
        putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
        putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
        putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
        putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
        putpixel(x_cord + 8, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
        putpixel(x_cord + 9, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
        putpixel(x_cord + 10, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
        putpixel(x_cord + 11, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
        putpixel(x_cord + 12, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
        putpixel(x_cord + 13, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
        putpixel(x_cord + 14, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
        putpixel(x_cord + 15, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
    }


    if (!(y_cord & 3))               // if the vertical coordinate has been scaled
    {
        virt_y_cord--;                 // file in the extra pixels

        if (bitsperline == 640)          // if an 80 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
            putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
            putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
            putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
            putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
            putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
            putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
            putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
        }

        else                           // if not an 80 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
            putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
            putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
            putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
            putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
            putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
            putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
            putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
            putpixel(x_cord + 8, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
            putpixel(x_cord + 9, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
            putpixel(x_cord + 10, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
            putpixel(x_cord + 11, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
            putpixel(x_cord + 12, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
            putpixel(x_cord + 13, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
            putpixel(x_cord + 14, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
            putpixel(x_cord + 15, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
        }

    }

}